

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

void Sbm_AddCardinConstrMerge(sat_solver *p,int *pVars,int lo,int hi,int r,int *pnVars)

{
  int iVar1;
  int local_40;
  int Cid;
  lit Lits [2];
  int step;
  int i;
  int *pnVars_local;
  int r_local;
  int hi_local;
  int lo_local;
  int *pVars_local;
  sat_solver *p_local;
  
  Lits[0] = r << 1;
  if (Lits[0] < hi - lo) {
    Sbm_AddCardinConstrMerge(p,pVars,lo,hi - r,Lits[0],pnVars);
    Sbm_AddCardinConstrMerge(p,pVars,lo + r,hi,Lits[0],pnVars);
    for (Lits[1] = lo + r; Lits[1] < hi - r; Lits[1] = Lits[0] + Lits[1]) {
      Sbm_AddSorter(p,pVars,Lits[1],Lits[1] + r,pnVars);
    }
    for (Lits[1] = lo + r; Lits[1] < (hi - r) + -1; Lits[1] = r + Lits[1]) {
      local_40 = Abc_Var2Lit(pVars[Lits[1]],0);
      Cid = Abc_Var2Lit(pVars[Lits[1] + r],1);
      iVar1 = sat_solver_addclause(p,&local_40,Lits);
      if (iVar1 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                      ,0x141,
                      "void Sbm_AddCardinConstrMerge(sat_solver *, int *, int, int, int, int *)");
      }
    }
  }
  return;
}

Assistant:

static inline void Sbm_AddCardinConstrMerge( sat_solver * p, int * pVars, int lo, int hi, int r, int * pnVars )
{
    int i, step = r * 2;
    if ( step < hi - lo )
    {
        Sbm_AddCardinConstrMerge( p, pVars, lo, hi-r, step, pnVars );
        Sbm_AddCardinConstrMerge( p, pVars, lo+r, hi, step, pnVars );
        for ( i = lo+r; i < hi-r; i += step )
            Sbm_AddSorter( p, pVars, i, i+r, pnVars );
        for ( i = lo+r; i < hi-r-1; i += r )
        {
            lit Lits[2] = { Abc_Var2Lit(pVars[i], 0), Abc_Var2Lit(pVars[i+r], 1) };
            int Cid = sat_solver_addclause( p, Lits, Lits + 2 );
            assert( Cid );
        }
    }
}